

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSat.c
# Opt level: O1

int Fra_NodesAreEquiv(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  int *piVar1;
  Fra_Par_t *pFVar2;
  int iVar3;
  int iVar4;
  sat_solver *psVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  timespec ts;
  int pLits [4];
  timespec local_60;
  long local_50;
  uint local_48;
  uint local_44;
  lit local_40 [4];
  
  if (((ulong)pNew & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0x37,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0x38,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (pNew == pOld) {
    __assert_fail("pNew != pOld",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0x39,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  pFVar2 = p->pPars;
  iVar8 = pFVar2->nBTLimitNode;
  if (((pFVar2->fSpeculate == 0) && (0 < iVar8 && pFVar2->nFramesK == 0)) &&
     (((pOld->field_0x18 & 0x20) != 0 || ((pNew->field_0x18 & 0x20) != 0)))) {
    p->nSatFails = p->nSatFails + 1;
    if (iVar8 < 0xb) {
      return -1;
    }
    dVar9 = pow((double)iVar8,0.7);
    iVar8 = (int)dVar9;
  }
  p->nSatCalls = p->nSatCalls + 1;
  p->nSatCallsRecent = p->nSatCallsRecent + 1;
  if (p->pSat == (sat_solver *)0x0) {
    psVar5 = sat_solver_new();
    p->pSat = psVar5;
    p->nSatVars = 1;
    sat_solver_setnvars(psVar5,1000);
    local_48 = 0;
    sat_solver_addclause(p->pSat,(lit *)&local_48,(lit *)&local_44);
  }
  Fra_CnfNodeAddToSolver(p,pOld,pNew);
  psVar5 = p->pSat;
  if (psVar5->qtail != psVar5->qhead) {
    iVar3 = sat_solver_simplify(psVar5);
    if (iVar3 == 0) {
      __assert_fail("status != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x5d,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assert_fail("p->pSat->qtail == p->pSat->qhead",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x5e,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  if (p->pPars->fConeBias != 0) {
    Fra_SetActivityFactors(p,pOld,pNew);
  }
  iVar3 = clock_gettime(3,&local_60);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  local_48 = *(int *)(*(long *)((long)(pOld->field_5).pData + 0x98) + (long)pOld->Id * 4) * 2;
  local_44 = (uint)(((*(uint *)&pNew->field_0x18 ^ *(uint *)&pOld->field_0x18) & 8) == 0) +
             *(int *)(*(long *)((long)(pNew->field_5).pData + 0x98) + (long)pNew->Id * 4) * 2;
  iVar3 = sat_solver_solve(p->pSat,(lit *)&local_48,local_40,(long)iVar8,0,p->nBTLimitGlobal,
                           p->nInsLimitGlobal);
  iVar4 = clock_gettime(3,&local_60);
  if (iVar4 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar7 + lVar6;
  if (iVar3 == 1) {
    iVar8 = clock_gettime(3,&local_60);
    if (iVar8 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    lVar7 = lVar7 + lVar6;
LAB_00602582:
    p->timeSatSat = p->timeSatSat + lVar7;
    Fra_SmlSavePattern(p);
    iVar3 = 0;
    lVar6 = 0xd4;
    goto LAB_006027bc;
  }
  if (iVar3 == -1) {
    iVar3 = clock_gettime(3,&local_60);
    if (iVar3 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    p->timeSatUnsat = p->timeSatUnsat + lVar7 + lVar6;
    local_48 = local_48 ^ 1;
    local_44 = local_44 ^ 1;
    iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_48,local_40);
    if (iVar3 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x75,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    iVar3 = 1;
    lVar6 = 0xdc;
    if (p->pManFraig->pConst1 == pOld) goto LAB_006027bc;
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      local_50 = 1;
    }
    else {
      lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
      local_50 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_60.tv_sec * -1000000;
    }
    local_48 = *(int *)(*(long *)((long)(pOld->field_5).pData + 0x98) + (long)pOld->Id * 4) * 2 + 1;
    local_44 = ((*(uint *)&pNew->field_0x18 ^ *(uint *)&pOld->field_0x18) >> 3 & 1) +
               *(int *)(*(long *)((long)(pNew->field_5).pData + 0x98) + (long)pNew->Id * 4) * 2;
    iVar8 = sat_solver_solve(p->pSat,(lit *)&local_48,local_40,(long)iVar8,0,p->nBTLimitGlobal,
                             p->nInsLimitGlobal);
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    p->timeSat = p->timeSat + lVar7 + local_50;
    if (iVar8 == 1) {
      iVar8 = clock_gettime(3,&local_60);
      if (iVar8 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      lVar7 = lVar7 + local_50;
      goto LAB_00602582;
    }
    if (iVar8 == -1) {
      iVar8 = clock_gettime(3,&local_60);
      if (iVar8 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      p->timeSatUnsat = p->timeSatUnsat + lVar7 + local_50;
      local_48 = local_48 ^ 1;
      local_44 = local_44 ^ 1;
      iVar8 = sat_solver_addclause(p->pSat,(lit *)&local_48,local_40);
      if (iVar8 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                      ,0xa1,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
      goto LAB_006027bc;
    }
    iVar8 = clock_gettime(3,&local_60);
    if (iVar8 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    p->timeSatFail = p->timeSatFail + lVar6 + local_50;
LAB_006027a7:
    pOld->field_0x18 = pOld->field_0x18 | 0x20;
  }
  else {
    iVar8 = clock_gettime(3,&local_60);
    if (iVar8 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    p->timeSatFail = p->timeSatFail + lVar7 + lVar6;
    if (p->pManFraig->pConst1 != pOld) goto LAB_006027a7;
  }
  pNew->field_0x18 = pNew->field_0x18 | 0x20;
  iVar3 = -1;
  lVar6 = 0xe4;
LAB_006027bc:
  piVar1 = (int *)((long)&p->pPars + lVar6);
  *piVar1 = *piVar1 + 1;
  return iVar3;
}

Assistant:

int Fra_NodesAreEquiv( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{
    int pLits[4], RetValue, RetValue1, nBTLimit;
    abctime clk;//, clk2 = Abc_Clock();
    int status;

    // make sure the nodes are not complemented
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    assert( pNew != pOld );

    // if at least one of the nodes is a failed node, perform adjustments:
    // if the backtrack limit is small, simply skip this node
    // if the backtrack limit is > 10, take the quare root of the limit
    nBTLimit = p->pPars->nBTLimitNode;
    if ( !p->pPars->fSpeculate && p->pPars->nFramesK == 0 && (nBTLimit > 0 && (pOld->fMarkB || pNew->fMarkB)) )
    {
        p->nSatFails++;
        // fail immediately
//        return -1;
        if ( nBTLimit <= 10 )
            return -1;
        nBTLimit = (int)pow(nBTLimit, 0.7);
    }

    p->nSatCalls++;
    p->nSatCallsRecent++;

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
    {
        p->pSat = sat_solver_new();
        p->nSatVars = 1;
        sat_solver_setnvars( p->pSat, 1000 );
        // var 0 is reserved for const1 node - add the clause
        pLits[0] = toLit( 0 );
        sat_solver_addclause( p->pSat, pLits, pLits + 1 );
    }

    // if the nodes do not have SAT variables, allocate them
    Fra_CnfNodeAddToSolver( p, pOld, pNew );

    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // prepare variable activity
    if ( p->pPars->fConeBias )
        Fra_SetActivityFactors( p, pOld, pNew ); 

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
clk = Abc_Clock();
    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), 0 );
    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), pOld->fPhase == pNew->fPhase );
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        // continue solving the other implication
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        Fra_SmlSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
        // mark the node as the failed node
        if ( pOld != p->pManFraig->pConst1 ) 
            pOld->fMarkB = 1;
        pNew->fMarkB = 1;
        p->nSatFailsReal++;
        return -1;
    }

    // if the old node was constant 0, we already know the answer
    if ( pOld == p->pManFraig->pConst1 )
    {
        p->nSatProof++;
        return 1;
    }

    // solve under assumptions
    // A = 0; B = 1     OR     A = 0; B = 0 
clk = Abc_Clock();
    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), 1 );
    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), pOld->fPhase ^ pNew->fPhase );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        Fra_SmlSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
        // mark the node as the failed node
        pOld->fMarkB = 1;
        pNew->fMarkB = 1;
        p->nSatFailsReal++;
        return -1;
    }
/*
    // check BDD proof
    {
        int RetVal;
        ABC_PRT( "Sat", Abc_Clock() - clk2 );
        clk2 = Abc_Clock();
        RetVal = Fra_NodesAreEquivBdd( pOld, pNew );
//        printf( "%d ", RetVal );
        assert( RetVal );
        ABC_PRT( "Bdd", Abc_Clock() - clk2 );
        printf( "\n" );
    }
*/
    // return SAT proof
    p->nSatProof++;
    return 1;
}